

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

bool __thiscall cmGlobalGenerator::CheckTargetsForPchCompilePdb(cmGlobalGenerator *this)

{
  cmLocalGenerator *pcVar1;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> uVar2;
  cmake *this_00;
  bool bVar3;
  byte bVar4;
  string *psVar5;
  string *__rhs;
  undefined8 uVar6;
  _Base_ptr p_Var7;
  allocator<char> local_dd;
  undefined4 local_dc;
  undefined1 local_d8 [72];
  string *local_90;
  _Base_ptr local_88;
  cmAlphaNum local_80;
  string e;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_d8,"C",(allocator<char> *)&e);
  bVar3 = GetLanguageEnabled(this,(string *)local_d8);
  if (bVar3) {
    std::__cxx11::string::~string((string *)local_d8);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"CXX",&local_dd);
    bVar3 = GetLanguageEnabled(this,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)local_d8);
    if (!bVar3) {
      bVar4 = 0;
      goto LAB_002138ae;
    }
  }
  local_d8._56_8_ =
       (this->LocalGenerators).
       super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_d8._48_8_ =
       (this->LocalGenerators).
       super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_dc = 0;
  local_d8._64_8_ = this;
  for (; local_d8._56_8_ != local_d8._48_8_; local_d8._56_8_ = local_d8._56_8_ + 8) {
    pcVar1 = (((pointer)local_d8._56_8_)->_M_t).
             super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
             super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
             super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
    local_88 = *(_Base_ptr *)
                ((long)&(pcVar1->GeneratorTargets).
                        super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                + 8);
    for (p_Var7 = *(_Base_ptr *)
                   &(pcVar1->GeneratorTargets).
                    super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                    ._M_impl; p_Var7 != local_88; p_Var7 = (_Base_ptr)&p_Var7->_M_parent) {
      bVar3 = cmGeneratorTarget::CanCompileSources
                        ((cmGeneratorTarget *)
                         *(__uniq_ptr_data<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>,_true,_true>
                           *)p_Var7);
      if (bVar3) {
        uVar2._M_t.super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
        ._M_t.super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
        super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
             *(__uniq_ptr_data<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>,_true,_true>
               *)p_Var7;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_d8,"ghs_integrity_app",(allocator<char> *)&local_80);
        cmGeneratorTarget::GetProperty
                  ((cmGeneratorTarget *)
                   uVar2._M_t.
                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                   .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,
                   (string *)local_d8);
        bVar3 = cmIsOn((cmValue)0x21374b);
        std::__cxx11::string::~string((string *)local_d8);
        if (!bVar3) {
          uVar2._M_t.
          super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>._M_t.
          super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
          super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
               *(__uniq_ptr_data<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>,_true,_true>
                 *)p_Var7;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_d8,"PRECOMPILE_HEADERS_REUSE_FROM",(allocator<char> *)&local_80
                    );
          psVar5 = cmGeneratorTarget::GetSafeProperty
                             ((cmGeneratorTarget *)
                              uVar2._M_t.
                              super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                              .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,
                              (string *)local_d8);
          std::__cxx11::string::~string((string *)local_d8);
          uVar2._M_t.
          super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>._M_t.
          super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
          super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
               *(__uniq_ptr_data<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>,_true,_true>
                 *)p_Var7;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_d8,"COMPILE_PDB_NAME",(allocator<char> *)&local_80);
          __rhs = cmGeneratorTarget::GetSafeProperty
                            ((cmGeneratorTarget *)
                             uVar2._M_t.
                             super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                             .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,
                             (string *)local_d8);
          std::__cxx11::string::~string((string *)local_d8);
          if (psVar5->_M_string_length != 0) {
            local_90 = psVar5;
            bVar3 = std::operator!=(psVar5,__rhs);
            if (bVar3) {
              local_d8._0_8_ = (pointer)0x3a;
              local_d8._8_8_ = "PRECOMPILE_HEADERS_REUSE_FROM property is set on target (\"";
              psVar5 = cmGeneratorTarget::GetName_abi_cxx11_
                                 ((cmGeneratorTarget *)
                                  *(__uniq_ptr_data<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>,_true,_true>
                                    *)p_Var7);
              local_80.View_._M_str = (psVar5->_M_dataplus)._M_p;
              local_80.View_._M_len = psVar5->_M_string_length;
              cmStrCat<char[91],std::__cxx11::string,char[3]>
                        (&e,(cmAlphaNum *)local_d8,&local_80,
                         (char (*) [91])
                         "\"). Reusable precompile headers requires the COMPILE_PDB_NAME property to have the value \""
                         ,local_90,(char (*) [3])0x64cd13);
              this_00 = *(cmake **)(local_d8._64_8_ + 0x78);
              cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_d8);
              cmake::IssueMessage(this_00,FATAL_ERROR,&e,(cmListFileBacktrace *)local_d8);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8));
              uVar6 = std::__cxx11::string::~string((string *)&e);
              local_dc = (undefined4)CONCAT71((int7)((ulong)uVar6 >> 8),1);
            }
          }
        }
      }
    }
  }
  bVar4 = (byte)local_dc;
LAB_002138ae:
  return (bool)(bVar4 & 1);
}

Assistant:

bool cmGlobalGenerator::CheckTargetsForPchCompilePdb() const
{
  if (!this->GetLanguageEnabled("C") && !this->GetLanguageEnabled("CXX")) {
    return false;
  }
  bool failed = false;
  for (const auto& generator : this->LocalGenerators) {
    for (const auto& target : generator->GetGeneratorTargets()) {
      if (!target->CanCompileSources() ||
          cmIsOn(target->GetProperty("ghs_integrity_app"))) {
        continue;
      }

      std::string const& reuseFrom =
        target->GetSafeProperty("PRECOMPILE_HEADERS_REUSE_FROM");
      std::string const& compilePdb =
        target->GetSafeProperty("COMPILE_PDB_NAME");

      if (!reuseFrom.empty() && reuseFrom != compilePdb) {
        const std::string e = cmStrCat(
          "PRECOMPILE_HEADERS_REUSE_FROM property is set on target (\"",
          target->GetName(),
          "\"). Reusable precompile headers requires the COMPILE_PDB_NAME"
          " property to have the value \"",
          reuseFrom, "\"\n");
        this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR, e,
                                               target->GetBacktrace());
        failed = true;
      }
    }
  }
  return failed;
}